

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrum.cpp
# Opt level: O1

void __thiscall
Sinclair::ZXSpectrum::ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)3>::advance
          (ConcreteMachine<(Analyser::Static::ZXSpectrum::Target::Model)3> *this,HalfCycles duration
          )

{
  uint8_t *puVar1;
  bool bVar2;
  Typer *this_00;
  long lVar3;
  long lVar4;
  uint uVar5;
  HalfCycles duration_00;
  
  (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ =
       (this->time_since_audio_update_).super_WrappedInt<HalfCycles>.length_ +
       (long)duration.super_WrappedInt<HalfCycles>.length_;
  duration_00.super_WrappedInt<HalfCycles>.length_ =
       (WrappedInt<HalfCycles>)
       ((this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_ +
       (long)duration.super_WrappedInt<HalfCycles>.length_);
  (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_ =
       (IntType)duration_00.super_WrappedInt<HalfCycles>.length_;
  (this->video_).is_flushed_ = false;
  lVar4 = (this->video_).time_until_event_.super_WrappedInt<HalfCycles>.length_;
  lVar3 = lVar4 - (long)duration.super_WrappedInt<HalfCycles>.length_;
  (this->video_).time_until_event_.super_WrappedInt<HalfCycles>.length_ = lVar3;
  if (lVar3 == 0 || lVar4 < (long)duration.super_WrappedInt<HalfCycles>.length_) {
    (this->video_).time_overrun_.super_WrappedInt<HalfCycles>.length_ = lVar3;
    (this->video_).is_flushed_ = true;
    (this->video_).did_flush_ = true;
    (this->video_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
    ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)1>::run_for
              (&(this->video_).object_,duration_00);
    JustInTimeActor<Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)1>,_HalfCycles,_1,_1>
    ::update_sequence_point(&this->video_);
  }
  bVar2 = (this->video_).did_flush_;
  (this->video_).did_flush_ = false;
  if (bVar2 == true) {
    uVar5 = (this->video_).object_.time_into_frame_ - 0x1b9be;
    if ((this->z80_).super_ProcessorBase.super_ProcessorStorage.irq_line_ != uVar5 < 0x40) {
      lVar4 = (this->video_).time_overrun_.super_WrappedInt<HalfCycles>.length_;
      (this->z80_).super_ProcessorBase.super_ProcessorStorage.irq_line_ = uVar5 < 0x40;
      if ((uVar5 < 0x40) && ((this->z80_).super_ProcessorBase.super_ProcessorStorage.iff1_ == true))
      {
        puVar1 = &(this->z80_).super_ProcessorBase.super_ProcessorStorage.request_status_;
        *puVar1 = *puVar1 | 1;
      }
      else {
        puVar1 = &(this->z80_).super_ProcessorBase.super_ProcessorStorage.request_status_;
        *puVar1 = *puVar1 & 0xfe;
      }
      if (lVar4 < -1) {
        (this->z80_).super_ProcessorBase.super_ProcessorStorage.last_request_status_ =
             (this->z80_).super_ProcessorBase.super_ProcessorStorage.request_status_ & 1 |
             (this->z80_).super_ProcessorBase.super_ProcessorStorage.last_request_status_ & 0xfe;
      }
    }
  }
  if (this->tape_player_is_sleeping_ == false) {
    Storage::Tape::BinaryTapePlayer::run_for
              (&this->tape_player_,(Cycles)duration.super_WrappedInt<HalfCycles>.length_);
  }
  if (((this->use_automatic_tape_motor_control_ == true) &&
      (lVar4 = (this->cycles_since_tape_input_read_).super_WrappedInt<HalfCycles>.length_,
      lVar4 < 0x361efb)) &&
     (lVar4 = lVar4 + (long)duration.super_WrappedInt<HalfCycles>.length_,
     (this->cycles_since_tape_input_read_).super_WrappedInt<HalfCycles>.length_ = lVar4,
     0x361efa < lVar4)) {
    Storage::Tape::BinaryTapePlayer::set_motor_control(&this->tape_player_,false);
    this->recent_tape_hits_ = 0;
  }
  this_00 = (this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>).typer_._M_t.
            super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
            super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
            super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl;
  if (this_00 != (Typer *)0x0) {
    Utility::Typer::run_for(this_00,duration);
    return;
  }
  return;
}

Assistant:

void advance(HalfCycles duration) {
			time_since_audio_update_ += duration;

			video_ += duration;
			if(video_.did_flush()) {
				z80_.set_interrupt_line(video_.last_valid()->get_interrupt_line(), video_.last_sequence_point_overrun());
			}

			if(!tape_player_is_sleeping_) tape_player_.run_for(duration.as_integral());

			// Update automatic tape motor control, if enabled; if it's been
			// 0.5 seconds since software last possibly polled the tape, stop it.
			if(use_automatic_tape_motor_control_ && cycles_since_tape_input_read_ < HalfCycles(clock_rate())) {
				cycles_since_tape_input_read_ += duration;

				if(cycles_since_tape_input_read_ >= HalfCycles(clock_rate())) {
					tape_player_.set_motor_control(false);
					recent_tape_hits_ = 0;
				}
			}

			if constexpr (model == Model::Plus3) {
				fdc_ += Cycles(duration.as_integral());
			}

			if(typer_) typer_->run_for(duration);
		}